

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O1

trie_node * trie_lookup(trie_node *root,lrtr_ip_addr *prefix,uint8_t mask_len,uint *lvl)

{
  lrtr_ip_addr a;
  lrtr_ip_addr prefix_00;
  lrtr_ip_addr b;
  _Bool _Var1;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff5c;
  lrtr_ip_version in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff74;
  lrtr_ip_addr local_80;
  lrtr_ip_addr local_68;
  lrtr_ip_addr local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (root != (trie_node *)0x0) {
    do {
      if (root->len <= mask_len) {
        lrtr_ip_addr_get_bits(&local_68,&root->prefix,'\0',root->len);
        lrtr_ip_addr_get_bits(&local_80,prefix,'\0',root->len);
        in_stack_ffffffffffffff60 = local_80.ver;
        a.u.addr6.addr[1] = local_68.u.addr6.addr[3];
        a._0_8_ = local_68.u._4_8_;
        a.u.addr6.addr[2] = in_stack_ffffffffffffff5c;
        a.u.addr6.addr[3] = in_stack_ffffffffffffff60;
        b.u.addr6.addr[1] = local_80.u.addr6.addr[3];
        b._0_8_ = local_80.u._4_8_;
        b.u._8_8_ = in_stack_ffffffffffffff74;
        _Var1 = lrtr_ip_addr_equal(a,b);
        if (_Var1) goto LAB_00113a37;
      }
      lrtr_ip_addr_get_bits(&local_50,prefix,(uint8_t)*lvl,'\x01');
      prefix_00.u.addr6.addr[1] = local_50.u.addr6.addr[3];
      prefix_00._0_8_ = local_50.u._4_8_;
      prefix_00.u.addr6.addr[2] = in_stack_ffffffffffffff5c;
      prefix_00.u.addr6.addr[3] = in_stack_ffffffffffffff60;
      _Var1 = lrtr_ip_addr_is_zero(prefix_00);
      root = (&root->rchild)[_Var1];
      *lvl = *lvl + 1;
    } while (root != (trie_node *)0x0);
  }
  root = (trie_node *)0x0;
LAB_00113a37:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return root;
  }
  __stack_chk_fail();
}

Assistant:

struct trie_node *trie_lookup(const struct trie_node *root, const struct lrtr_ip_addr *prefix, const uint8_t mask_len,
			      unsigned int *lvl)
{
	while (root) {
		if (root->len <= mask_len && lrtr_ip_addr_equal(lrtr_ip_addr_get_bits(&root->prefix, 0, root->len),
								lrtr_ip_addr_get_bits(prefix, 0, root->len)))
			return (struct trie_node *)root;

		if (is_left_child(prefix, *lvl))
			root = root->lchild;
		else
			root = root->rchild;

		(*lvl)++;
	}
	return NULL;
}